

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

string * optionEntryTypeToString_abi_cxx11_(string *__return_storage_ptr__,HighsOptionType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (type == kDouble) {
    pcVar2 = "double";
    pcVar1 = "";
  }
  else if (type == kInt) {
    pcVar2 = "HighsInt";
    pcVar1 = "";
  }
  else if (type == kBool) {
    pcVar2 = "bool";
    pcVar1 = "";
  }
  else {
    pcVar2 = "string";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string optionEntryTypeToString(const HighsOptionType type) {
  if (type == HighsOptionType::kBool) {
    return "bool";
  } else if (type == HighsOptionType::kInt) {
    return "HighsInt";
  } else if (type == HighsOptionType::kDouble) {
    return "double";
  } else {
    return "string";
  }
}